

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscr_storage_adaptive.cpp
# Opt level: O0

void __thiscall
so_5::impl::adaptive_subscr_storage::storage_t::storage_t
          (storage_t *this,agent_t *owner,size_t threshold,
          subscription_storage_unique_ptr_t *small_storage,
          subscription_storage_unique_ptr_t *large_storage)

{
  pointer psVar1;
  subscription_storage_unique_ptr_t *large_storage_local;
  subscription_storage_unique_ptr_t *small_storage_local;
  size_t threshold_local;
  agent_t *owner_local;
  storage_t *this_local;
  
  subscription_storage_t::subscription_storage_t(&this->super_subscription_storage_t,owner);
  (this->super_subscription_storage_t)._vptr_subscription_storage_t =
       (_func_int **)&PTR__storage_t_005c19c0;
  this->m_threshold = threshold;
  std::
  unique_ptr<so_5::impl::subscription_storage_t,_std::default_delete<so_5::impl::subscription_storage_t>_>
  ::unique_ptr(&this->m_small_storage,small_storage);
  std::
  unique_ptr<so_5::impl::subscription_storage_t,_std::default_delete<so_5::impl::subscription_storage_t>_>
  ::unique_ptr(&this->m_large_storage,large_storage);
  this->m_current_storage = (subscription_storage_t *)0x0;
  psVar1 = std::
           unique_ptr<so_5::impl::subscription_storage_t,_std::default_delete<so_5::impl::subscription_storage_t>_>
           ::get(&this->m_small_storage);
  this->m_current_storage = psVar1;
  return;
}

Assistant:

storage_t::storage_t(
	agent_t * owner,
	std::size_t threshold,
	subscription_storage_unique_ptr_t small_storage,
	subscription_storage_unique_ptr_t large_storage )
	:	subscription_storage_t( owner )
	,	m_threshold( threshold )
	,	m_small_storage( std::move( small_storage ) )
	,	m_large_storage( std::move( large_storage ) )
	{
		m_current_storage = m_small_storage.get();
	}